

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::BeginLoopInst::Exec
          (BeginLoopInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  Label beginLabel;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  GroupInfo *this_01;
  undefined4 *puVar3;
  ResumeCont *this_02;
  RepeatLoopCont *this_03;
  uint8 *puVar4;
  int local_4c;
  int i;
  LoopInfo *loopInfo;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  BeginLoopInst *this_local;
  
  origLoopInfo = Matcher::LoopIdToLoopInfo
                           (matcher,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  if ((((this->super_GreedyMixin).isGreedy & 1U) == 0) &&
     (((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.hasOuterLoops & 1U) != 0)) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId,origLoopInfo,
               matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  local_4c = (this->super_BodyGroupsMixin).minBodyGroupId;
  do {
    if ((this->super_BodyGroupsMixin).maxBodyGroupId < local_4c) {
      origLoopInfo->number = 0;
      origLoopInfo->startInputOffset = *inputOffset;
      if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower == 0) {
        if (((this->super_GreedyMixin).isGreedy & 1U) == 0) {
          if ((BeginLoopInst *)*instPointer != this) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                               ,0xb6a,"(instPointer == (uint8*)this)","instPointer == (uint8*)this")
            ;
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 0;
          }
          this_03 = (RepeatLoopCont *)
                    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                    Push<UnifiedRegex::RepeatLoopCont>
                              (&contStack->
                                super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>
                              );
          beginLabel = Matcher::InstPointerToLabel(matcher,*instPointer);
          RepeatLoopCont::RepeatLoopCont(this_03,beginLabel,*inputOffset);
          puVar4 = Matcher::LabelToInstPointer(matcher,(this->super_BeginLoopMixin).exitLabel);
          *instPointer = puVar4;
        }
        else {
          this_02 = (ResumeCont *)
                    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                    Push<UnifiedRegex::ResumeCont>
                              (&contStack->
                                super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>
                              );
          ResumeCont::ResumeCont(this_02,*inputOffset,(this->super_BeginLoopMixin).exitLabel);
          *instPointer = *instPointer + 0x1c;
        }
        Matcher::PushStats(matcher,contStack,input);
      }
      else {
        *instPointer = *instPointer + 0x1c;
      }
      return false;
    }
    this_01 = Matcher::GroupIdToGroupInfo(matcher,local_4c);
    bVar2 = GroupInfo::IsUndefined(this_01);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0xb58,"(matcher.GroupIdToGroupInfo(i)->IsUndefined())",
                         "matcher.GroupIdToGroupInfo(i)->IsUndefined()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

inline bool BeginLoopInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop has outer loops, the continuation stack may have choicepoints from an earlier "run" of this loop
        // which, when backtracked to, may expect the loopInfo state to be as it was at the time the choicepoint was
        // pushed.
        //  - If the loop is greedy with deterministic body, there may be Resumes into the follow of the loop, but
        //    they won't look at the loopInfo state so there's nothing to do.
        //  - If the loop is greedy, or if it is non-greedy with lower > 0, AND it has a non-deterministic body,
        //    we may have Resume entries which will resume inside the loop body, which may then run to a
        //    RepeatLoop, which will then look at the loopInfo state. However, each iteration is protected by
        //    a RestoreLoop by RepeatLoopInst below. (****)
        //  - If the loop is non-greedy there may be a RepeatLoop on the stack, so we must restore the loopInfo
        //    state before backtracking to it.
        if (!isGreedy && hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // The loop body must always begin with empty inner groups
        //  - if the loop is not in an outer they will be empty due to the reset when the match began
        //  - if the loop is in an outer loop, they will have been reset by the outer loop's RepeatLoop instruction
#if DBG
        for (int i = minBodyGroupId; i <= maxBodyGroupId; i++)
        {
            Assert(matcher.GroupIdToGroupInfo(i)->IsUndefined());
        }
#endif

        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        if (repeats.lower == 0)
        {
            if (isGreedy)
            {
                // CHOICEPOINT: Try one iteration of body, if backtrack continue from here with no iterations
                PUSH(contStack, ResumeCont, inputOffset, exitLabel);
                instPointer += sizeof(*this);
            }
            else
            {
                // CHOICEPOINT: Try no iterations of body, if backtrack do one iteration of body from here
                Assert(instPointer == (uint8*)this);
                PUSH(contStack, RepeatLoopCont, matcher.InstPointerToLabel(instPointer), inputOffset);
                instPointer = matcher.LabelToInstPointer(exitLabel);
            }
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        else
        {
            // Must match minimum iterations, so continue to loop body
            instPointer += sizeof(*this);
        }

        return false;
    }